

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

uint8_t __thiscall wabt::ElemSegment::GetFlags(ElemSegment *this,Module *module)

{
  int iVar1;
  long *plVar2;
  byte bVar3;
  Index IVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  
  iVar1 = *(int *)this;
  if (iVar1 == 2) {
    bVar3 = 3;
  }
  else if (iVar1 == 1) {
    bVar3 = 1;
  }
  else if (iVar1 == 0) {
    IVar4 = BindingHash::FindIndex(&module->table_bindings,(Var *)(this + 0x28));
    bVar3 = (IVar4 != 0 || *(int *)(this + 0x70) != -0x10) * '\x02';
  }
  else {
    bVar3 = 0;
  }
  if (*(int *)(this + 0x70) != -0x10) goto LAB_001460d2;
  plVar5 = *(long **)(this + 0x90);
  plVar2 = *(long **)(this + 0x98);
  lVar8 = (long)plVar2 - (long)plVar5;
  lVar7 = (lVar8 >> 3) * -0x5555555555555555 >> 2;
  if (0 < lVar7) {
    lVar8 = lVar7 + 1;
    plVar6 = plVar5 + 6;
    do {
      if (plVar6[-4] == 0) goto LAB_001460dc;
      if (*(int *)(plVar6[-6] + 0x38) != 0x24) {
        plVar6 = plVar6 + -6;
        goto LAB_001460cd;
      }
      if (plVar6[-1] == 0) goto LAB_001460dc;
      if (*(int *)(plVar6[-3] + 0x38) != 0x24) {
        plVar6 = plVar6 + -3;
        goto LAB_001460cd;
      }
      if (plVar6[2] == 0) goto LAB_001460dc;
      if (*(int *)(*plVar6 + 0x38) != 0x24) goto LAB_001460cd;
      if (plVar6[5] == 0) goto LAB_001460dc;
      if (*(int *)(plVar6[3] + 0x38) != 0x24) {
        plVar6 = plVar6 + 3;
        goto LAB_001460cd;
      }
      lVar8 = lVar8 + -1;
      plVar6 = plVar6 + 0xc;
    } while (1 < lVar8);
    lVar8 = (long)plVar2 - (long)(plVar5 + lVar7 * 0xc);
    plVar5 = plVar5 + lVar7 * 0xc;
  }
  lVar7 = (lVar8 >> 3) * -0x5555555555555555;
  if (lVar7 == 1) {
LAB_001460a6:
    if (plVar5[2] == 0) {
LAB_001460dc:
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                    ,0x18a,
                    "typename intrusive_list<T>::const_reference wabt::intrusive_list<wabt::Expr>::front() const [T = wabt::Expr]"
                   );
    }
    plVar6 = plVar5;
    if (*(int *)(*plVar5 + 0x38) == 0x24) {
      plVar6 = plVar2;
    }
  }
  else if (lVar7 == 2) {
LAB_00146092:
    if (plVar5[2] == 0) goto LAB_001460dc;
    plVar6 = plVar5;
    if (*(int *)(*plVar5 + 0x38) == 0x24) {
      plVar5 = plVar5 + 3;
      goto LAB_001460a6;
    }
  }
  else {
    if (lVar7 != 3) {
      return bVar3;
    }
    if (plVar5[2] == 0) goto LAB_001460dc;
    plVar6 = plVar5;
    if (*(int *)(*plVar5 + 0x38) == 0x24) {
      plVar5 = plVar5 + 3;
      goto LAB_00146092;
    }
  }
LAB_001460cd:
  if (plVar6 == plVar2) {
    return bVar3;
  }
LAB_001460d2:
  return bVar3 | 4;
}

Assistant:

uint8_t ElemSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  switch (kind) {
    case SegmentKind::Active: {
      Index table_index = module->GetTableIndex(table_var);
      if (elem_type != Type::FuncRef || table_index != 0) {
        flags |= SegExplicitIndex;
      }
      break;
    }

    case SegmentKind::Passive:
      flags |= SegPassive;
      break;

    case SegmentKind::Declared:
      flags |= SegDeclared;
      break;
  }

  bool all_ref_func =
      elem_type == Type::FuncRef &&
      std::all_of(elem_exprs.begin(), elem_exprs.end(),
                  [](const ExprList& elem_expr) {
                    return elem_expr.front().type() == ExprType::RefFunc;
                  });

  if (!all_ref_func) {
    flags |= SegUseElemExprs;
  }

  return flags;
}